

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

void __thiscall
embree::XMLLoader::XMLLoader
          (XMLLoader *this,FileName *fileName,AffineSpace3fa *space,SharedState *state)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  char *pcVar13;
  FILE *xml_00;
  FILE *pFVar14;
  long lVar15;
  _Base_ptr p_Var16;
  size_t sVar17;
  long *plVar18;
  runtime_error *this_00;
  SharedState *in_RCX;
  long *plVar19;
  undefined8 *in_RDX;
  long in_RDI;
  bool bVar20;
  size_t i_1;
  Ref<embree::SceneGraph::Node> last;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> group;
  Ref<embree::XML> xml;
  Ref<embree::XML> *in_stack_000011d8;
  XMLLoader *in_stack_000011e0;
  FileName *in_stack_fffffffffffff8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8e0;
  GroupNode *in_stack_fffffffffffff8e8;
  size_t in_stack_fffffffffffff8f8;
  undefined1 in_stack_fffffffffffff900;
  undefined1 in_stack_fffffffffffff901;
  undefined1 in_stack_fffffffffffff902;
  undefined1 in_stack_fffffffffffff903;
  undefined1 in_stack_fffffffffffff904;
  undefined1 in_stack_fffffffffffff905;
  undefined1 in_stack_fffffffffffff906;
  undefined1 in_stack_fffffffffffff907;
  string *in_stack_fffffffffffff920;
  FileName *in_stack_fffffffffffff928;
  undefined8 in_stack_fffffffffffff948;
  undefined1 hasHeader;
  string *in_stack_fffffffffffff950;
  FileName *in_stack_fffffffffffff958;
  string *in_stack_fffffffffffff980;
  ParseLocation *in_stack_fffffffffffff988;
  AffineSpace3fa *in_stack_fffffffffffff9d8;
  AffineSpace3fa *in_stack_fffffffffffff9e0;
  TransformNode *in_stack_fffffffffffff9e8;
  XMLLoader *this_01;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined1 local_4f1;
  string local_4d0 [32];
  long *local_4b0;
  ulong local_4a8;
  long *local_4a0;
  undefined1 local_498 [16];
  AffineSpace3fa *local_488;
  _Base_ptr local_480;
  allocator local_471;
  string local_470 [32];
  undefined1 local_450 [16];
  string local_440 [71];
  allocator local_3f9;
  string local_3f8 [32];
  undefined1 local_3d8 [152];
  long *local_340;
  _Base_ptr local_338;
  _Base_ptr local_330;
  _Base_ptr local_328;
  Ref<embree::SceneGraph::Node> local_318;
  long **local_308;
  long **local_2f8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  _Base_ptr local_2a8;
  _Base_ptr *local_2a0;
  _Base_ptr *local_298;
  _Base_ptr *local_290;
  _Base_ptr *local_280;
  undefined1 *local_278;
  _Base_ptr local_270;
  undefined1 *local_268;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  long *local_238;
  long *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_218;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  undefined8 *local_200;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined8 *local_1e8;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  hasHeader = (undefined1)((ulong)in_stack_fffffffffffff948 >> 0x38);
  local_3d8._80_8_ = in_RCX;
  local_3d8._88_8_ = in_RDX;
  embree::FileName::FileName((FileName *)0x3be9d7);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  embree::FileName::FileName((FileName *)0x3be9f8);
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x50) = local_3d8._80_8_;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  std::
  map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  ::map((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
         *)0x3bea2f);
  std::
  map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  ::map((map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
         *)0x3bea4b);
  local_250 = (undefined8 *)(in_RDI + 0xc0);
  *local_250 = 0;
  embree::FileName::path(in_stack_fffffffffffff928);
  embree::FileName::operator=((FileName *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  embree::FileName::~FileName((FileName *)0x3beab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,".bin",&local_3f9);
  embree::FileName::setExt((FileName *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  this_01 = (XMLLoader *)local_3d8;
  embree::FileName::operator=((FileName *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  embree::FileName::~FileName((FileName *)0x3beb51);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  pcVar13 = embree::FileName::c_str((FileName *)0x3beb78);
  xml_00 = fopen(pcVar13,"rb");
  *(FILE **)(in_RDI + 0x20) = xml_00;
  if (*(long *)(in_RDI + 0x20) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_440,".bin",(allocator *)(local_450 + 0xf));
    embree::FileName::addExt(in_stack_fffffffffffff928,in_stack_fffffffffffff920);
    embree::FileName::operator=((FileName *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    embree::FileName::~FileName((FileName *)0x3bec57);
    std::__cxx11::string::~string(local_440);
    std::allocator<char>::~allocator((allocator<char> *)(local_450 + 0xf));
    pcVar13 = embree::FileName::c_str((FileName *)0x3bec7e);
    pFVar14 = fopen(pcVar13,"rb");
    *(FILE **)(in_RDI + 0x20) = pFVar14;
  }
  if (*(long *)(in_RDI + 0x20) != 0) {
    fseek(*(FILE **)(in_RDI + 0x20),0,2);
    lVar15 = ftell(*(FILE **)(in_RDI + 0x20));
    *(long *)(in_RDI + 0x48) = lVar15;
    fseek(*(FILE **)(in_RDI + 0x20),0,0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"",&local_471);
  parseXML(in_stack_fffffffffffff958,in_stack_fffffffffffff950,(bool)hasHeader);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  local_2b0 = local_450;
  bVar11 = std::operator==(in_stack_fffffffffffff8e0,(char *)in_stack_fffffffffffff8d8);
  if (bVar11) {
    p_Var16 = (_Base_ptr)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode
              ((GroupNode *)
               CONCAT17(in_stack_fffffffffffff907,
                        CONCAT16(in_stack_fffffffffffff906,
                                 CONCAT15(in_stack_fffffffffffff905,
                                          CONCAT14(in_stack_fffffffffffff904,
                                                   CONCAT13(in_stack_fffffffffffff903,
                                                            CONCAT12(in_stack_fffffffffffff902,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff901,
                                                  in_stack_fffffffffffff900))))))),
               in_stack_fffffffffffff8f8);
    local_2a0 = &local_480;
    local_2a8 = p_Var16;
    local_480 = p_Var16;
    if (p_Var16 != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var16 + 0x10))();
    }
    local_488 = (AffineSpace3fa *)0x0;
    while( true ) {
      local_2b8 = local_450;
      in_stack_fffffffffffff9e0 = local_488;
      in_stack_fffffffffffff9e8 = (TransformNode *)local_450._0_8_;
      in_stack_fffffffffffff9d8 = (AffineSpace3fa *)XML::size((XML *)0x3bef91);
      if (in_stack_fffffffffffff9d8 <= in_stack_fffffffffffff9e0) break;
      local_298 = &local_480;
      local_2c0 = local_450;
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 (local_450._0_8_ + 0x80),(size_type)local_488);
      loadNode(in_stack_000011e0,in_stack_000011d8);
      SceneGraph::GroupNode::add
                (in_stack_fffffffffffff8e8,
                 (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff8e0);
      local_328 = (_Base_ptr)(local_498 + 8);
      if (local_498._8_8_ != 0) {
        (**(code **)(*(long *)local_498._8_8_ + 0x18))();
      }
      local_488 = (AffineSpace3fa *)((long)&(local_488->l).vx.field_0 + 1);
    }
    local_278 = local_498;
    local_280 = &local_480;
    local_270 = local_480;
    local_268 = local_498;
    local_498._0_8_ = local_480;
    if (local_480 != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_480 + 0x10))();
    }
    p_Var16 = (_Base_ptr)(in_RDI + 0xc0);
    local_338 = (_Base_ptr)local_498;
    local_330 = p_Var16;
    if (*(long *)p_Var16 != 0) {
      (**(code **)(**(long **)p_Var16 + 0x18))();
    }
    uVar9 = *(undefined4 *)&local_338->field_0x4;
    p_Var16->_M_color = local_338->_M_color;
    *(undefined4 *)&p_Var16->field_0x4 = uVar9;
    *(long *)local_338 = 0;
    local_318.ptr = (Node *)local_498;
    if ((_Base_ptr)local_498._0_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_498._0_8_ + 0x18))();
    }
    local_290 = &local_480;
    if (local_480 != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_480 + 0x18))();
    }
  }
  else {
    local_2c8 = local_450;
    bVar11 = std::operator==(in_stack_fffffffffffff8e0,(char *)in_stack_fffffffffffff8d8);
    if (!bVar11) {
      local_4f1 = 1;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_2e0 = local_450;
      ParseLocation::str_abi_cxx11_(in_stack_fffffffffffff988);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0);
      std::runtime_error::runtime_error(this_00,local_4d0);
      local_4f1 = 0;
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_3d8._136_8_ = &local_4a0;
    local_4a0 = (long *)0x0;
    local_3d8._128_8_ = (_Base_ptr)0x0;
    local_4a8 = 0;
    while( true ) {
      uVar10 = local_4a8;
      local_2d0 = local_450;
      sVar17 = XML::size((XML *)0x3bf4cb);
      if (sVar17 <= uVar10) break;
      local_2d8 = local_450;
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 (local_450._0_8_ + 0x80),local_4a8);
      loadBGFNode(this_01,(Ref<embree::XML> *)xml_00);
      plVar18 = (long *)(in_RDI + 0xc0);
      local_3d8._144_8_ = &local_4b0;
      local_340 = plVar18;
      if (*plVar18 != 0) {
        (**(code **)(*(long *)*plVar18 + 0x18))();
      }
      *plVar18 = (long)*(long **)local_3d8._144_8_;
      *(long **)local_3d8._144_8_ = (long *)0x0;
      local_308 = &local_4b0;
      if (local_4b0 != (long *)0x0) {
        (**(code **)(*local_4b0 + 0x18))();
      }
      local_4a8 = local_4a8 + 1;
    }
    local_2f8 = &local_4a0;
    if (local_4a0 != (long *)0x0) {
      (**(code **)(*local_4a0 + 0x18))();
    }
  }
  local_260 = &local_538;
  local_120 = &one;
  local_1a0 = &embree::zero;
  local_1a8 = &embree::zero;
  local_204 = 0x3f800000;
  local_208 = 0;
  local_20c = 0;
  local_134 = 0;
  local_138 = 0;
  local_13c = 0;
  local_140 = 0x3f800000;
  local_158 = 0x3f800000;
  uStack_150 = 0;
  local_538 = 0x3f800000;
  uStack_530 = 0;
  local_1e8 = &local_528;
  local_1b0 = &embree::zero;
  local_128 = &one;
  local_1b8 = &embree::zero;
  local_1ec = 0;
  local_1f0 = 0x3f800000;
  local_1f4 = 0;
  local_15c = 0;
  local_160 = 0;
  local_164 = 0x3f800000;
  local_168 = 0;
  local_178 = 0x3f80000000000000;
  uStack_170 = 0;
  local_528 = 0x3f80000000000000;
  uStack_520 = 0;
  local_1d0 = &local_518;
  local_1c0 = &embree::zero;
  local_1c8 = &embree::zero;
  local_130 = &one;
  local_1d4 = 0;
  local_1d8 = 0;
  local_1dc = 0x3f800000;
  local_17c = 0;
  local_180 = 0x3f800000;
  local_184 = 0;
  local_188 = 0;
  local_198 = 0;
  uStack_190 = 0x3f800000;
  local_518 = 0;
  uStack_510 = 0x3f800000;
  local_258 = &local_508;
  local_228 = 0;
  uStack_220 = 0;
  local_508 = 0;
  uStack_500 = 0;
  local_240 = (undefined8 *)local_3d8._88_8_;
  local_248 = &local_538;
  local_110 = (undefined8 *)local_3d8._88_8_;
  local_e0 = (undefined8 *)local_3d8._88_8_;
  uVar1 = *(undefined8 *)local_3d8._88_8_;
  uVar2 = *(undefined8 *)(local_3d8._88_8_ + 8);
  local_68 = 0x3f800000;
  uStack_60 = 0;
  local_58._0_4_ = (float)uVar1;
  local_58._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_50._0_4_ = (float)uVar2;
  uStack_50._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_b8 = -(uint)((float)local_58 == 1.0);
  iStack_b4 = -(uint)(local_58._4_4_ == 0.0);
  iStack_b0 = -(uint)((float)uStack_50 == 0.0);
  iStack_ac = -(uint)(uStack_50._4_4_ == 0.0);
  auVar6._4_4_ = iStack_b4;
  auVar6._0_4_ = local_b8;
  auVar6._8_4_ = iStack_b0;
  auVar6._12_4_ = iStack_ac;
  uVar12 = movmskps((int)local_248,auVar6);
  bVar11 = false;
  if ((uVar12 & 7) == 7) {
    local_f0 = (undefined8 *)(local_3d8._88_8_ + 0x10);
    local_f8 = &local_528;
    uVar3 = *local_f0;
    uVar4 = *(undefined8 *)(local_3d8._88_8_ + 0x18);
    local_48 = 0x3f80000000000000;
    uStack_40 = 0;
    local_38._0_4_ = (float)uVar3;
    local_38._4_4_ = (float)((ulong)uVar3 >> 0x20);
    uStack_30._0_4_ = (float)uVar4;
    uStack_30._4_4_ = (float)((ulong)uVar4 >> 0x20);
    local_a8 = -(uint)((float)local_38 == 0.0);
    iStack_a4 = -(uint)(local_38._4_4_ == 1.0);
    iStack_a0 = -(uint)((float)uStack_30 == 0.0);
    iStack_9c = -(uint)(uStack_30._4_4_ == 0.0);
    auVar7._4_4_ = iStack_a4;
    auVar7._0_4_ = local_a8;
    auVar7._8_4_ = iStack_a0;
    auVar7._12_4_ = iStack_9c;
    uVar12 = movmskps((int)local_f8,auVar7);
    bVar11 = false;
    local_38 = uVar3;
    uStack_30 = uVar4;
    if ((uVar12 & 7) == 7) {
      local_100 = (undefined8 *)(local_3d8._88_8_ + 0x20);
      local_108 = &local_518;
      uVar3 = *local_100;
      uVar4 = *(undefined8 *)(local_3d8._88_8_ + 0x28);
      local_28 = 0;
      uStack_20 = 0x3f800000;
      local_18._0_4_ = (float)uVar3;
      local_18._4_4_ = (float)((ulong)uVar3 >> 0x20);
      uStack_10._0_4_ = (float)uVar4;
      uStack_10._4_4_ = (float)((ulong)uVar4 >> 0x20);
      local_98 = -(uint)((float)local_18 == 0.0);
      iStack_94 = -(uint)(local_18._4_4_ == 0.0);
      iStack_90 = -(uint)((float)uStack_10 == 1.0);
      iStack_8c = -(uint)(uStack_10._4_4_ == 0.0);
      auVar8._4_4_ = iStack_94;
      auVar8._0_4_ = local_98;
      auVar8._8_4_ = iStack_90;
      auVar8._12_4_ = iStack_8c;
      uVar12 = movmskps((int)local_108,auVar8);
      bVar11 = (uVar12 & 7) == 7;
      local_18 = uVar3;
      uStack_10 = uVar4;
    }
  }
  bVar20 = false;
  if (bVar11) {
    local_d0 = (undefined8 *)(local_3d8._88_8_ + 0x30);
    local_d8 = &local_508;
    uVar3 = *local_d0;
    uVar4 = *(undefined8 *)(local_3d8._88_8_ + 0x38);
    local_88 = 0;
    uStack_80 = 0;
    local_78._0_4_ = (float)uVar3;
    local_78._4_4_ = (float)((ulong)uVar3 >> 0x20);
    uStack_70._0_4_ = (float)uVar4;
    uStack_70._4_4_ = (float)((ulong)uVar4 >> 0x20);
    local_c8 = -(uint)((float)local_78 == 0.0);
    iStack_c4 = -(uint)(local_78._4_4_ == 0.0);
    iStack_c0 = -(uint)((float)uStack_70 == 0.0);
    iStack_bc = -(uint)(uStack_70._4_4_ == 0.0);
    auVar5._4_4_ = iStack_c4;
    auVar5._0_4_ = local_c8;
    auVar5._8_4_ = iStack_c0;
    auVar5._12_4_ = iStack_bc;
    uVar12 = movmskps((int)local_d8,auVar5);
    bVar20 = (uVar12 & 7) == 7;
    local_78 = uVar3;
    uStack_70 = uVar4;
  }
  local_218 = local_260;
  local_200 = local_260;
  local_118 = local_248;
  local_e8 = local_248;
  local_58 = uVar1;
  uStack_50 = uVar2;
  if (!bVar20) {
    plVar18 = (long *)SceneGraph::TransformNode::operator_new(0x3bfdc5);
    SceneGraph::TransformNode::TransformNode
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
               (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff9d8);
    plVar19 = (long *)(in_RDI + 0xc0);
    local_238 = plVar18;
    local_230 = plVar19;
    if (plVar18 != (long *)0x0) {
      (**(code **)(*plVar18 + 0x10))();
    }
    if (*plVar19 != 0) {
      (**(code **)(*(long *)*plVar19 + 0x18))();
    }
    *plVar19 = (long)local_238;
  }
  local_3d8._112_8_ = local_450;
  if ((TransformNode *)local_450._0_8_ != (TransformNode *)0x0) {
    (**(code **)(*(long *)local_450._0_8_ + 0x18))();
  }
  return;
}

Assistant:

XMLLoader::XMLLoader(const FileName& fileName, const AffineSpace3fa& space, SharedState& state)
    : binFile(nullptr), binFileSize(0), state(state), currentNodeID(0)
  {
    path = fileName.path();
    binFileName = fileName.setExt(".bin");
    binFile = fopen(binFileName.c_str(),"rb");
    if (!binFile) {
      binFileName = fileName.addExt(".bin");
      binFile = fopen(binFileName.c_str(),"rb");
    }
    if (binFile) {
      fseek(binFile, 0L, SEEK_END);
      binFileSize = ftell(binFile);
      fseek(binFile, 0L, SEEK_SET);
    }


    Ref<XML> xml = parseXML(fileName);
    if (xml->name == "scene") 
    {
      Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
      for (size_t i=0; i<xml->size(); i++) { 
        group->add(loadNode(xml->children[i]));
      }
      root = group.cast<SceneGraph::Node>();
    }
    else if (xml->name == "BGFscene") 
    {
      Ref<SceneGraph::Node> last = nullptr;
      for (size_t i=0; i<xml->size(); i++) { 
        root = loadBGFNode(xml->children[i]);
      }
    }
    else 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid scene tag");

    if (space == AffineSpace3fa(one)) 
      return;
    
    root = new SceneGraph::TransformNode(space,root);
  }